

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_NurbsSurface::MakeRational(ON_NurbsSurface *this)

{
  bool bVar1;
  ON_BezierSurface local_38;
  
  bVar1 = true;
  if (this->m_is_rat == 0) {
    ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
    ON_BezierSurface::ON_BezierSurface(&local_38);
    local_38.m_dim = this->m_dim;
    local_38.m_is_rat = this->m_is_rat;
    local_38.m_order[0] = this->m_cv_count[0];
    local_38.m_order[1] = this->m_cv_count[1];
    local_38.m_cv_stride = *&this->m_cv_stride;
    local_38.m_cv = this->m_cv;
    local_38.m_cv_capacity = this->m_cv_capacity;
    ON_BezierSurface::MakeRational(&local_38);
    this->m_is_rat = local_38.m_is_rat;
    *&this->m_cv_stride = local_38.m_cv_stride;
    this->m_cv = local_38.m_cv;
    local_38.m_cv = (double *)0x0;
    ON_BezierSurface::~ON_BezierSurface(&local_38);
    bVar1 = this->m_is_rat != 0;
  }
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::MakeRational()
{
  if ( !IsRational() ) 
  {
    DestroySurfaceTree();
    ON_BezierSurface b;
    b.m_dim = m_dim;
    b.m_is_rat = m_is_rat;
    b.m_order[0] = m_cv_count[0];
    b.m_order[1] = m_cv_count[1];
    b.m_cv_stride[0] = m_cv_stride[0];
    b.m_cv_stride[1] = m_cv_stride[1];
    b.m_cv = m_cv;
		b.m_cv_capacity = m_cv_capacity;
	  b.MakeRational();
    m_is_rat = b.m_is_rat;
    m_cv_stride[0] = b.m_cv_stride[0];
    m_cv_stride[1] = b.m_cv_stride[1];
    m_cv = b.m_cv;
    b.m_cv = 0;
  }
  return IsRational();
}